

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-repo.c
# Opt level: O3

int on_interest(uint8_t *interest,uint32_t interest_size,void *userdata)

{
  ndn_data_t local_e20;
  undefined1 local_590 [8];
  ndn_interest_t interest_pkt;
  ndn_encoder_t encoder;
  
  ndn_interest_from_block((ndn_interest_t *)local_590,interest,interest_size);
  puts("On interest: ");
  ndn_name_print((ndn_name_t *)local_590);
  memcpy(&local_e20,(ndn_interest_t *)local_590,0x1bc);
  builtin_memcpy(local_e20.content_value,"I\'m a Data packet.",0x12);
  local_e20.content_size = 0x12;
  local_e20.metainfo.content_type = '\0';
  local_e20.metainfo.enable_ContentType = '\x01';
  local_e20.metainfo.enable_FreshnessPeriod = '\x01';
  local_e20.metainfo.enable_FinalBlockId = '\0';
  local_e20.metainfo.freshness_period = 10000;
  memset(buf,0,0x1000);
  interest_pkt.signature._648_8_ = buf;
  ndn_data_tlv_encode_digest_sign
            ((ndn_encoder_t *)(interest_pkt.signature.validity_period.not_after + 9),&local_e20);
  ndn_forwarder_put_data((uint8_t *)interest_pkt.signature._648_8_,0);
  return 0;
}

Assistant:

int
on_interest(const uint8_t* interest, uint32_t interest_size, void* userdata)
{
  ndn_interest_t interest_pkt;
  ndn_interest_from_block(&interest_pkt, interest, interest_size);
  ndn_data_t data;
  ndn_encoder_t encoder;
  char * str = "I'm a Data packet.";

  printf("On interest: \n");
  ndn_name_print(&interest_pkt.name);
  data.name = interest_pkt.name;
  ndn_data_set_content(&data, (uint8_t*)str, strlen(str));
  ndn_metainfo_init(&data.metainfo);
  ndn_metainfo_set_content_type(&data.metainfo, NDN_CONTENT_TYPE_BLOB);
  ndn_metainfo_set_freshness_period(&data.metainfo, 10000);
  encoder_init(&encoder, buf, 4096);
  ndn_data_tlv_encode_digest_sign(&encoder, &data);
  ndn_forwarder_put_data(encoder.output_value, encoder.offset);

  return NDN_FWD_STRATEGY_SUPPRESS;
}